

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2ktx2.cpp
# Opt level: O2

bool __thiscall ktxUpgrader::processOption(ktxUpgrader *this,argparser *parser,int opt)

{
  string *psVar1;
  int iVar2;
  long lVar3;
  
  if (opt == 0x6f) {
    psVar1 = &(this->options).super_commandOptions.outfile;
    std::__cxx11::string::_M_assign((string *)psVar1);
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 != 0) {
      lVar3 = std::__cxx11::string::rfind((char)psVar1,0x2e);
      if (lVar3 != -1) {
        return true;
      }
      std::__cxx11::string::append((char *)psVar1);
      return true;
    }
    (this->options).super_commandOptions.field_0x44 = 1;
  }
  else if (opt == 0x66) {
    (this->options).super_commandOptions.field_0x45 = 1;
  }
  else {
    if (opt != 0x62) {
      return false;
    }
    (this->options).super_commandOptions.field_0x46 = 1;
  }
  return true;
}

Assistant:

bool
ktxUpgrader::processOption(argparser& parser, int opt)
{
    switch (opt) {
      case 'b':
        options.rewriteBadOrientation = true;
        break;
     case 'f':
        options.force = true;
        break;
     case 'o':
        options.outfile = parser.optarg;
        if (!options.outfile.compare("stdout")) {
            options.useStdout = true;
        } else {
            size_t dot;
            dot = options.outfile.find_last_of('.');
            if (dot ==string::npos) {
                options.outfile += ".ktx2";
            }
        }
        break;
      default:
        return false;
    }
    return true;
}